

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

mir_size_t type_size(c2m_ctx_t c2m_ctx,type *type)

{
  mir_size_t local_28;
  mir_size_t size;
  type *type_local;
  c2m_ctx_t c2m_ctx_local;
  
  local_28 = raw_type_size(c2m_ctx,type);
  if (type->align != 0) {
    local_28 = round_size(local_28,(long)type->align);
  }
  return local_28;
}

Assistant:

static mir_size_t type_size (c2m_ctx_t c2m_ctx, struct type *type) {
  mir_size_t size = raw_type_size (c2m_ctx, type);

  return type->align == 0 ? size : round_size (size, type->align);
}